

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui_mainwindow.h
# Opt level: O2

void __thiscall Ui_MainWindow::setupUi(Ui_MainWindow *this,QMainWindow *MainWindow)

{
  storage_type *psVar1;
  QWidget *pQVar2;
  QVBoxLayout *this_00;
  QPushButton *this_01;
  QHBoxLayout *pQVar3;
  QLabel *pQVar4;
  QSpacerItem *pQVar5;
  GameBoard *this_02;
  QMenuBar *this_03;
  QStatusBar *this_04;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QArrayDataPointer<char16_t> local_48;
  
  QObject::objectName();
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (local_48.size == 0) {
    psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("MainWindow",0xb);
    QVar6.m_data = psVar1;
    QVar6.m_size = (qsizetype)&local_48;
    QString::fromUtf8(QVar6);
    QObject::setObjectName((QString *)MainWindow);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  }
  QWidget::resize((QWidget *)MainWindow,0x250,0x1d7);
  pQVar2 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar2,MainWindow,0);
  this->centralwidget = pQVar2;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("centralwidget",0xe);
  QVar7.m_data = psVar1;
  QVar7.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar7);
  QObject::setObjectName((QString *)pQVar2);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,this->centralwidget);
  this->verticalLayout = this_00;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("verticalLayout",0xf);
  QVar8.m_data = psVar1;
  QVar8.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar8);
  QObject::setObjectName((QString *)this_00);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  this_01 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(this_01,this->centralwidget);
  this->beginNewGameButton = this_01;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("beginNewGameButton",0x13);
  QVar9.m_data = psVar1;
  QVar9.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar9);
  QObject::setObjectName((QString *)this_01);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QBoxLayout::addWidget(this->verticalLayout,this->beginNewGameButton,0,0);
  pQVar3 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar3);
  this->horizontalLayout = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("horizontalLayout",0x11);
  QVar10.m_data = psVar1;
  QVar10.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar10);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  pQVar4 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar4,this->centralwidget,0);
  this->player1Label = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("player1Label",0xd);
  QVar11.m_data = psVar1;
  QVar11.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar11);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->player1Label,0));
  QBoxLayout::addWidget(this->horizontalLayout,this->player1Label,0,0);
  pQVar4 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar4,this->centralwidget,0);
  this->player1Score = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("player1Score",0xd);
  QVar12.m_data = psVar1;
  QVar12.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar12);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->player1Score,0));
  QBoxLayout::addWidget(this->horizontalLayout,this->player1Score,0,0);
  pQVar5 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar5 = QObject::objectName;
  *(undefined8 *)(pQVar5 + 8) = 0x2800000000;
  *(undefined8 *)(pQVar5 + 0x10) = 0x17000000000014;
  *(undefined4 *)(pQVar5 + 0x18) = 0;
  *(undefined4 *)(pQVar5 + 0x1c) = 0;
  *(undefined4 *)(pQVar5 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar5 + 0x24) = 0xffffffff;
  this->horizontalSpacer = pQVar5;
  (**(code **)(*(long *)this->horizontalLayout + 0x80))(this->horizontalLayout,pQVar5);
  QBoxLayout::addLayout((QLayout *)this->verticalLayout,(int)this->horizontalLayout);
  pQVar3 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(pQVar3);
  this->horizontalLayout_2 = pQVar3;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("horizontalLayout_2",0x13);
  QVar13.m_data = psVar1;
  QVar13.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar13);
  QObject::setObjectName((QString *)pQVar3);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  pQVar4 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar4,this->centralwidget,0);
  this->player2Label = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("player2Label",0xd);
  QVar14.m_data = psVar1;
  QVar14.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar14);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QBoxLayout::addWidget(this->horizontalLayout_2,this->player2Label,0,0);
  pQVar4 = (QLabel *)operator_new(0x28);
  QLabel::QLabel(pQVar4,this->centralwidget,0);
  this->player2Score = pQVar4;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("player2Score",0xd);
  QVar15.m_data = psVar1;
  QVar15.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar15);
  QObject::setObjectName((QString *)pQVar4);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QWidget::sizePolicy();
  QWidget::setSizePolicy((QSizePolicy)SUB84(this->player2Score,0));
  QBoxLayout::addWidget(this->horizontalLayout_2,this->player2Score,0,0);
  pQVar5 = (QSpacerItem *)operator_new(0x28);
  *(code **)pQVar5 = QObject::objectName;
  *(undefined8 *)(pQVar5 + 8) = 0x2800000000;
  *(undefined8 *)(pQVar5 + 0x10) = 0x17000000000014;
  *(undefined4 *)(pQVar5 + 0x18) = 0;
  *(undefined4 *)(pQVar5 + 0x1c) = 0;
  *(undefined4 *)(pQVar5 + 0x20) = 0xffffffff;
  *(undefined4 *)(pQVar5 + 0x24) = 0xffffffff;
  this->horizontalSpacer_2 = pQVar5;
  (**(code **)(*(long *)this->horizontalLayout_2 + 0x80))(this->horizontalLayout_2,pQVar5);
  QBoxLayout::addLayout((QLayout *)this->verticalLayout,(int)this->horizontalLayout_2);
  this_02 = (GameBoard *)operator_new(0x70);
  GameBoard::GameBoard(this_02,this->centralwidget);
  this->gameBoard = this_02;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("gameBoard",10);
  QVar16.m_data = psVar1;
  QVar16.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar16);
  QObject::setObjectName((QString *)this_02);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QBoxLayout::addWidget(this->verticalLayout,this->gameBoard,0,0);
  QMainWindow::setCentralWidget((QWidget *)MainWindow);
  this_03 = (QMenuBar *)operator_new(0x28);
  QMenuBar::QMenuBar(this_03,(QWidget *)MainWindow);
  this->menubar = this_03;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("menubar",8);
  QVar17.m_data = psVar1;
  QVar17.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar17);
  QObject::setObjectName((QString *)this_03);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x150000024f;
  QWidget::setGeometry((QRect *)this->menubar);
  QMainWindow::setMenuBar((QMenuBar *)MainWindow);
  this_04 = (QStatusBar *)operator_new(0x28);
  QStatusBar::QStatusBar(this_04,(QWidget *)MainWindow);
  this->statusbar = this_04;
  psVar1 = (storage_type *)QByteArrayView::lengthHelperCharArray("statusbar",10);
  QVar18.m_data = psVar1;
  QVar18.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar18);
  QObject::setObjectName((QString *)this_04);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  QMainWindow::setStatusBar((QStatusBar *)MainWindow);
  retranslateUi(this,MainWindow);
  QMetaObject::connectSlotsByName((QObject *)MainWindow);
  return;
}

Assistant:

void setupUi(QMainWindow *MainWindow)
    {
        if (MainWindow->objectName().isEmpty())
            MainWindow->setObjectName(QString::fromUtf8("MainWindow"));
        MainWindow->resize(592, 471);
        centralwidget = new QWidget(MainWindow);
        centralwidget->setObjectName(QString::fromUtf8("centralwidget"));
        verticalLayout = new QVBoxLayout(centralwidget);
        verticalLayout->setObjectName(QString::fromUtf8("verticalLayout"));
        beginNewGameButton = new QPushButton(centralwidget);
        beginNewGameButton->setObjectName(QString::fromUtf8("beginNewGameButton"));

        verticalLayout->addWidget(beginNewGameButton);

        horizontalLayout = new QHBoxLayout();
        horizontalLayout->setObjectName(QString::fromUtf8("horizontalLayout"));
        player1Label = new QLabel(centralwidget);
        player1Label->setObjectName(QString::fromUtf8("player1Label"));
        QSizePolicy sizePolicy(QSizePolicy::Preferred, QSizePolicy::Fixed);
        sizePolicy.setHorizontalStretch(0);
        sizePolicy.setVerticalStretch(0);
        sizePolicy.setHeightForWidth(player1Label->sizePolicy().hasHeightForWidth());
        player1Label->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(player1Label);

        player1Score = new QLabel(centralwidget);
        player1Score->setObjectName(QString::fromUtf8("player1Score"));
        sizePolicy.setHeightForWidth(player1Score->sizePolicy().hasHeightForWidth());
        player1Score->setSizePolicy(sizePolicy);

        horizontalLayout->addWidget(player1Score);

        horizontalSpacer = new QSpacerItem(40, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        horizontalLayout->addItem(horizontalSpacer);


        verticalLayout->addLayout(horizontalLayout);

        horizontalLayout_2 = new QHBoxLayout();
        horizontalLayout_2->setObjectName(QString::fromUtf8("horizontalLayout_2"));
        player2Label = new QLabel(centralwidget);
        player2Label->setObjectName(QString::fromUtf8("player2Label"));

        horizontalLayout_2->addWidget(player2Label);

        player2Score = new QLabel(centralwidget);
        player2Score->setObjectName(QString::fromUtf8("player2Score"));
        sizePolicy.setHeightForWidth(player2Score->sizePolicy().hasHeightForWidth());
        player2Score->setSizePolicy(sizePolicy);

        horizontalLayout_2->addWidget(player2Score);

        horizontalSpacer_2 = new QSpacerItem(40, 20, QSizePolicy::Expanding, QSizePolicy::Minimum);

        horizontalLayout_2->addItem(horizontalSpacer_2);


        verticalLayout->addLayout(horizontalLayout_2);

        gameBoard = new GameBoard(centralwidget);
        gameBoard->setObjectName(QString::fromUtf8("gameBoard"));

        verticalLayout->addWidget(gameBoard);

        MainWindow->setCentralWidget(centralwidget);
        menubar = new QMenuBar(MainWindow);
        menubar->setObjectName(QString::fromUtf8("menubar"));
        menubar->setGeometry(QRect(0, 0, 592, 22));
        MainWindow->setMenuBar(menubar);
        statusbar = new QStatusBar(MainWindow);
        statusbar->setObjectName(QString::fromUtf8("statusbar"));
        MainWindow->setStatusBar(statusbar);

        retranslateUi(MainWindow);

        QMetaObject::connectSlotsByName(MainWindow);
    }